

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

void uo_cb_thrd_quit(void)

{
  long lVar1;
  long *in_FS_OFFSET;
  
  if (in_FS_OFFSET[-5] != 0) {
    lVar1 = *in_FS_OFFSET;
    uo_queue_enqueue(uo_cb_func_linkpool_queue,(void *)in_FS_OFFSET[-6],true);
    *(undefined8 *)(lVar1 + -0x28) = 0;
    *(undefined8 *)(lVar1 + -0x20) = 0;
  }
  if (in_FS_OFFSET[-8] != 0) {
    lVar1 = *in_FS_OFFSET;
    uo_queue_enqueue(uo_cb_linkpool_queue,(void *)in_FS_OFFSET[-9],true);
    *(undefined8 *)(lVar1 + -0x40) = 0;
    *(undefined8 *)(lVar1 + -0x38) = 0;
  }
  uo_refcount_linkpool_thrd_quit();
  return;
}

Assistant:

void uo_cb_thrd_quit()
{
    uo_cb_func_linkpool_thrd_quit();
    uo_cb_linkpool_thrd_quit();
    uo_refcount_linkpool_thrd_quit();
}